

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

double r8_factorial(int n)

{
  undefined8 local_18;
  double value;
  int i;
  int n_local;
  
  local_18 = 1.0;
  for (value._0_4_ = 1; value._0_4_ <= n; value._0_4_ = value._0_4_ + 1) {
    local_18 = local_18 * (double)value._0_4_;
  }
  return local_18;
}

Assistant:

double r8_factorial ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    R8_FACTORIAL computes the factorial of N.
//
//  Discussion:
//
//    factorial ( N ) = product ( 1 <= I <= N ) I
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 January 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the argument of the factorial function.
//    If N is less than 1, the function value is returned as 1.
//
//    Output, double R8_FACTORIAL, the factorial of N.
//
{
  int i;
  double value;

  value = 1.0;

  for ( i = 1; i <= n; i++ )
  {
    value = value * double( i );
  }

  return value;
}